

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O2

void __thiscall scheduler_tests::mockforward::test_method(mockforward *this)

{
  long lVar1;
  Function f;
  Function f_00;
  Function f_01;
  Function f_02;
  time_point tVar2;
  long lVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  size_t *psVar5;
  int *piVar6;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  check_type cVar7;
  undefined8 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  _Manager_type in_stack_fffffffffffffd68;
  _Invoker_type in_stack_fffffffffffffd70;
  assertion_result local_280;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  thread scheduler_thread;
  char *local_1c0;
  char *local_1b8;
  lazy_ostream local_1b0;
  undefined1 *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  size_t num_tasks;
  time_point last;
  time_point first;
  function<void_()> local_158;
  function<void_()> local_138;
  function<void_()> local_118;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  int counter;
  CScheduler scheduler;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScheduler::CScheduler(&scheduler);
  local_f8._M_unused._M_object = &counter;
  counter = 0;
  local_f8._8_8_ = 0;
  local_e0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp:179:34)>
             ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp:179:34)>
             ::_M_manager;
  std::function<void_()>::function(&local_118,(function<void_()> *)&local_f8);
  f.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd60;
  f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd58;
  f.super__Function_base._M_manager = in_stack_fffffffffffffd68;
  f._M_invoker = in_stack_fffffffffffffd70;
  CScheduler::scheduleFromNow(&scheduler,f,(milliseconds)&local_118);
  std::_Function_base::~_Function_base(&local_118.super__Function_base);
  std::function<void_()>::function(&local_138,(function<void_()> *)&local_f8);
  f_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd60;
  f_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd58;
  f_00.super__Function_base._M_manager = in_stack_fffffffffffffd68;
  f_00._M_invoker = in_stack_fffffffffffffd70;
  CScheduler::scheduleFromNow(&scheduler,f_00,(milliseconds)&local_138);
  std::_Function_base::~_Function_base(&local_138.super__Function_base);
  std::function<void_()>::function(&local_158,(function<void_()> *)&local_f8);
  f_01.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd60;
  f_01.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd58;
  f_01.super__Function_base._M_manager = in_stack_fffffffffffffd68;
  f_01._M_invoker = in_stack_fffffffffffffd70;
  CScheduler::scheduleFromNow(&scheduler,f_01,(milliseconds)&local_158);
  std::_Function_base::~_Function_base(&local_158.super__Function_base);
  first.__d.__r = (duration)0;
  last.__d.__r = (duration)0;
  num_tasks = CScheduler::getQueueInfo(&scheduler,&first,&last);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xbe;
  file.m_begin = (iterator)&local_180;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_190,msg);
  local_1b0.m_empty = false;
  local_1b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_1a0 = boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1b8 = "";
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x3;
  local_280._1_7_ = 0;
  pvVar4 = (iterator)0x2;
  psVar5 = &num_tasks;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_1b0,&local_1c0,0xbe,1,2,psVar5,"num_tasks",&local_280,"3ul");
  scheduler_thread._M_id._M_thread = (id)0;
  local_1b0._vptr_lazy_ostream = (_func_int **)operator_new(0x10);
  *local_1b0._vptr_lazy_ostream = (_func_int *)&PTR___State_0113de58;
  local_1b0._vptr_lazy_ostream[1] = (_func_int *)&scheduler;
  std::thread::_M_start_thread(&scheduler_thread,&local_1b0,0);
  if (local_1b0._vptr_lazy_ostream != (_func_int **)0x0) {
    (**(code **)(*local_1b0._vptr_lazy_ostream + 8))();
  }
  CScheduler::MockForward(&scheduler,(seconds)0x12c);
  local_1e8._8_8_ = 0;
  local_1d0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp:198:31)>
              ::_M_invoke;
  local_1d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp:198:31)>
              ::_M_manager;
  f_02.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffd60;
  f_02.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffd58;
  f_02.super__Function_base._M_manager = in_stack_fffffffffffffd68;
  f_02._M_invoker = in_stack_fffffffffffffd70;
  local_1e8._M_unused._M_object = &scheduler;
  CScheduler::scheduleFromNow(&scheduler,f_02,(milliseconds)&local_1e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
  std::thread::join();
  num_tasks = CScheduler::getQueueInfo(&scheduler,&first,&last);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)psVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0xcb;
  file_00.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_208,
             msg_00);
  local_1b0.m_empty = false;
  local_1b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_1a0 = boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_210 = "";
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_280._1_7_ = 0;
  pvVar4 = (iterator)0x2;
  psVar5 = &num_tasks;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_1b0,&local_218,0xcb,1,2,psVar5,"num_tasks",&local_280,"1ul");
  local_228 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)psVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0xce;
  file_01.m_begin = (iterator)&local_228;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_238,
             msg_01);
  local_1b0.m_empty = false;
  local_1b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139f30;
  local_1a0 = boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_240 = "";
  local_280._0_4_ = 2;
  pvVar4 = (iterator)0x2;
  piVar6 = &counter;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_1b0,&local_248,0xce,1,2,piVar6,"counter",&local_280,"2");
  lVar3 = std::chrono::_V2::steady_clock::now();
  tVar2 = first;
  local_258 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/scheduler_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar7 = 0x49580a;
  msg_02.m_end = (iterator)piVar6;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0xd4;
  file_02.m_begin = (iterator)&local_258;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_268,
             msg_02);
  local_280.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)((int)(((long)tVar2.__d.__r - lVar3) / 1000000000) - 0x79U < 0x3b);
  local_280.m_message.px = (element_type *)0x0;
  local_280.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198 = &stack0xfffffffffffffd70;
  local_1b0.m_empty = false;
  local_1b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
  local_1a0 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_280,&local_1b0,1,0,WARN,_cVar7,(size_t)&stack0xfffffffffffffd60,0xd4);
  boost::detail::shared_count::~shared_count(&local_280.m_message.pn);
  std::thread::~thread(&scheduler_thread);
  std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  CScheduler::~CScheduler(&scheduler);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(mockforward)
{
    CScheduler scheduler;

    int counter{0};
    CScheduler::Function dummy = [&counter]{counter++;};

    // schedule jobs for 2, 5 & 8 minutes into the future

    scheduler.scheduleFromNow(dummy, std::chrono::minutes{2});
    scheduler.scheduleFromNow(dummy, std::chrono::minutes{5});
    scheduler.scheduleFromNow(dummy, std::chrono::minutes{8});

    // check taskQueue
    std::chrono::steady_clock::time_point first, last;
    size_t num_tasks = scheduler.getQueueInfo(first, last);
    BOOST_CHECK_EQUAL(num_tasks, 3ul);

    std::thread scheduler_thread([&]() { scheduler.serviceQueue(); });

    // bump the scheduler forward 5 minutes
    scheduler.MockForward(std::chrono::minutes{5});

    // ensure scheduler has chance to process all tasks queued for before 1 ms from now.
    scheduler.scheduleFromNow([&scheduler] { scheduler.stop(); }, std::chrono::milliseconds{1});
    scheduler_thread.join();

    // check that the queue only has one job remaining
    num_tasks = scheduler.getQueueInfo(first, last);
    BOOST_CHECK_EQUAL(num_tasks, 1ul);

    // check that the dummy function actually ran
    BOOST_CHECK_EQUAL(counter, 2);

    // check that the time of the remaining job has been updated
    auto now = std::chrono::steady_clock::now();
    int delta = std::chrono::duration_cast<std::chrono::seconds>(first - now).count();
    // should be between 2 & 3 minutes from now
    BOOST_CHECK(delta > 2*60 && delta < 3*60);
}